

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

Names * __thiscall
cmGeneratorTarget::GetExecutableNames
          (Names *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  string *psVar1;
  bool bVar2;
  TargetType TVar3;
  string *psVar4;
  cmValue cVar5;
  long *plVar6;
  size_type *psVar7;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string prefix;
  string suffix;
  string local_b8;
  string local_98;
  string local_78;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->Base)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Base).field_2
  ;
  (__return_storage_ptr__->Base)._M_string_length = 0;
  (__return_storage_ptr__->Base).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Output)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Output).field_2;
  (__return_storage_ptr__->Output)._M_string_length = 0;
  (__return_storage_ptr__->Output).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Real)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Real).field_2
  ;
  (__return_storage_ptr__->Real)._M_string_length = 0;
  (__return_storage_ptr__->Real).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->ImportLibrary)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->ImportLibrary).field_2;
  (__return_storage_ptr__->ImportLibrary)._M_string_length = 0;
  (__return_storage_ptr__->ImportLibrary).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->PDB)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->PDB).field_2;
  (__return_storage_ptr__->PDB)._M_string_length = 0;
  (__return_storage_ptr__->PDB).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->SharedObject)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->SharedObject).field_2;
  (__return_storage_ptr__->SharedObject)._M_string_length = 0;
  (__return_storage_ptr__->SharedObject).field_2._M_local_buf[0] = '\0';
  bVar2 = cmTarget::IsImported(this->Target);
  if (bVar2) {
    psVar4 = cmTarget::GetName_abi_cxx11_(this->Target);
    local_b8.field_2._8_8_ = (psVar4->_M_dataplus)._M_p;
    local_b8.field_2._M_allocated_capacity = psVar4->_M_string_length;
    local_b8._M_dataplus._M_p = &DAT_0000002e;
    local_b8._M_string_length = 0x6a97f2;
    views._M_len = 2;
    views._M_array = (iterator)&local_b8;
    cmCatViews_abi_cxx11_(&local_98,views);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,
                      CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                               local_98.field_2._M_local_buf[0]) + 1);
    }
  }
  local_b8._M_string_length = 7;
  local_b8.field_2._M_allocated_capacity = 0x4e4f4953524556;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  cVar5 = GetProperty(this,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  TVar3 = cmTarget::GetType(this->Target);
  if (TVar3 == EXECUTABLE) {
    local_b8.field_2._M_allocated_capacity._0_6_ = 0x45444f4358;
    local_b8._M_string_length = 5;
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    bVar2 = cmMakefile::IsOn(this->Makefile,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (!bVar2) goto LAB_00359fb2;
  }
  cVar5.Value = (string *)0x0;
LAB_00359fb2:
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_allocated_capacity =
       local_b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  GetFullNameInternal(this,config,RuntimeBinaryArtifact,&local_b8,&__return_storage_ptr__->Base,
                      &local_98);
  local_58 = cVar5.Value;
  std::operator+(&local_50,&local_b8,&__return_storage_ptr__->Base);
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_50,(ulong)local_98._M_dataplus._M_p);
  psVar7 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_78.field_2._M_allocated_capacity = *psVar7;
    local_78.field_2._8_8_ = plVar6[3];
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  }
  else {
    local_78.field_2._M_allocated_capacity = *psVar7;
    local_78._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_78._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->Output,(string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  psVar4 = &__return_storage_ptr__->Real;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_assign((string *)psVar4);
  psVar1 = local_58;
  if (local_58 != (string *)0x0) {
    std::__cxx11::string::append((char *)psVar4);
    std::__cxx11::string::_M_append((char *)psVar4,(ulong)(psVar1->_M_dataplus)._M_p);
  }
  GetFullNameInternal(&local_78,this,config,ImportLibraryArtifact);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->ImportLibrary,(string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  GetPDBName(&local_78,this,config);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->PDB,(string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

cmGeneratorTarget::Names cmGeneratorTarget::GetExecutableNames(
  const std::string& config) const
{
  cmGeneratorTarget::Names targetNames;

  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if (this->IsImported()) {
    std::string msg = cmStrCat(
      "GetExecutableNames called on imported target: ", this->GetName());
    this->LocalGenerator->IssueMessage(MessageType::INTERNAL_ERROR, msg);
  }

// This versioning is supported only for executables and then only
// when the platform supports symbolic links.
#if defined(_WIN32) && !defined(__CYGWIN__)
  cmValue version;
#else
  // Check for executable version properties.
  cmValue version = this->GetProperty("VERSION");
  if (this->GetType() != cmStateEnums::EXECUTABLE ||
      this->Makefile->IsOn("XCODE")) {
    version = nullptr;
  }
#endif

  // Get the components of the executable name.
  std::string prefix;
  std::string suffix;
  this->GetFullNameInternal(config, cmStateEnums::RuntimeBinaryArtifact,
                            prefix, targetNames.Base, suffix);

  // The executable name.
  targetNames.Output = prefix + targetNames.Base + suffix;

// The executable's real name on disk.
#if defined(__CYGWIN__)
  targetNames.Real = prefix + targetNames.Base;
#else
  targetNames.Real = targetNames.Output;
#endif
  if (version) {
    targetNames.Real += "-";
    targetNames.Real += *version;
  }
#if defined(__CYGWIN__)
  targetNames.Real += suffix;
#endif

  // The import library name.
  targetNames.ImportLibrary =
    this->GetFullNameInternal(config, cmStateEnums::ImportLibraryArtifact);

  // The program database file name.
  targetNames.PDB = this->GetPDBName(config);

  return targetNames;
}